

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

apx_error_t
apx_server_insert_modified_node_instance(apx_server_t *self,apx_nodeInstance_t *node_instance)

{
  adt_error_t aVar1;
  adt_error_t rc;
  apx_nodeInstance_t *node_instance_local;
  apx_server_t *self_local;
  
  if ((self == (apx_server_t *)0x0) || (node_instance == (apx_nodeInstance_t *)0x0)) {
    self_local._4_4_ = 1;
  }
  else {
    aVar1 = adt_ary_push_unique(&self->modified_nodes,node_instance);
    if (aVar1 == '\x02') {
      self_local._4_4_ = 2;
    }
    else if (aVar1 == '\0') {
      self_local._4_4_ = 0;
    }
    else {
      self_local._4_4_ = -1;
    }
  }
  return self_local._4_4_;
}

Assistant:

apx_error_t apx_server_insert_modified_node_instance(apx_server_t* self, apx_nodeInstance_t* node_instance)
{
   if ( (self != NULL) && (node_instance != NULL))
   {
      adt_error_t rc = adt_ary_push_unique(&self->modified_nodes, (void*)node_instance);
      if (rc == ADT_MEM_ERROR)
      {
         return APX_MEM_ERROR;
      }
      else if(rc != APX_NO_ERROR)
      {
         return APX_GENERIC_ERROR;
      }
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}